

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsHasIndexedPropertiesExternalData(JsValueRef object,bool *value)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  DynamicObject *this_00;
  ArrayObject *obj;
  byte local_a1;
  ArrayObject *objectArray;
  DynamicObject *dynamicObject;
  DebugCheckNoException local_40;
  DebugCheckNoException __debugCheckNoException;
  bool *value_local;
  JsValueRef object_local;
  TypeId local_18;
  TypeId typeId;
  
  if (object == (JsValueRef)0x0) {
    object_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (value == (bool *)0x0) {
    object_local._4_4_ = JsErrorNullArgument;
  }
  else {
    __debugCheckNoException = (DebugCheckNoException)value;
    DebugCheckNoException::DebugCheckNoException(&local_40);
    *(undefined1 *)__debugCheckNoException = 0;
    if (object == (JsValueRef)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = Js::TaggedInt::Is(object);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = Js::JavascriptNumber::Is_NoTaggedIntCheck(object);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        this = Js::UnsafeVarTo<Js::RecyclableObject>(object);
        if (this == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                             ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        local_18 = Js::RecyclableObject::GetTypeId(this);
        if ((0x57 < (int)local_18) && (BVar3 = Js::RecyclableObject::IsExternal(this), BVar3 == 0))
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                             ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                             "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
    }
    bVar2 = Js::DynamicType::Is(local_18);
    if (bVar2) {
      this_00 = Js::UnsafeVarTo<Js::DynamicObject>(object);
      obj = Js::DynamicObject::GetObjectArray(this_00);
      local_a1 = 0;
      if (obj != (ArrayObject *)0x0) {
        bVar2 = Js::DynamicObject::IsAnyArray(&obj->super_DynamicObject);
        local_a1 = bVar2 ^ 0xff;
      }
      *(byte *)__debugCheckNoException = local_a1 & 1;
    }
    local_40.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_40);
    object_local._4_4_ = JsNoError;
  }
  return object_local._4_4_;
}

Assistant:

CHAKRA_API JsHasIndexedPropertiesExternalData(_In_ JsValueRef object, _Out_ bool *value)
{
    VALIDATE_JSREF(object);
    PARAM_NOT_NULL(value);

    BEGIN_JSRT_NO_EXCEPTION
    {
        *value = false;

        if (Js::DynamicType::Is(Js::JavascriptOperators::GetTypeId(object)))
        {
            Js::DynamicObject* dynamicObject = Js::UnsafeVarTo<Js::DynamicObject>(object);
            Js::ArrayObject* objectArray = dynamicObject->GetObjectArray();
            *value = (objectArray && !Js::DynamicObject::IsAnyArray(objectArray));
        }
    }